

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckerTester.cpp
# Opt level: O0

void __thiscall psy::C::TypeCheckerTester::case0732(TypeCheckerTester *this)

{
  Expectation *pEVar1;
  string local_1e0;
  Expectation local_1c0;
  Expectation local_108;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *s;
  TypeCheckerTester *this_local;
  
  local_18 = 
  "\nstruct s {\n    struct {\n        struct {\n            const int m ;\n        } ;\n    } ;\n} ;\nvoid _ ()\n{\n    struct s x = { { { 42 } } };\n    struct s y ;\n    y = x ;\n}\n"
  ;
  s = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "\nstruct s {\n    struct {\n        struct {\n            const int m ;\n        } ;\n    } ;\n} ;\nvoid _ ()\n{\n    struct s x = { { { 42 } } };\n    struct s y ;\n    y = x ;\n}\n"
             ,&local_39);
  Expectation::Expectation(&local_1c0);
  std::__cxx11::string::string
            ((string *)&local_1e0,
             (string *)
             &TypeChecker::DiagnosticsReporter::
              ID_of_CannotAssignToExpressionOfConstQualifiedType_abi_cxx11_);
  pEVar1 = Expectation::diagnostic(&local_1c0,Error,&local_1e0);
  Expectation::Expectation(&local_108,pEVar1);
  checkTypes(this,&local_38,&local_108);
  Expectation::~Expectation(&local_108);
  std::__cxx11::string::~string((string *)&local_1e0);
  Expectation::~Expectation(&local_1c0);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void TypeCheckerTester::case0732()
{
    auto s = R"(
struct s {
    struct {
        struct {
            const int m ;
        } ;
    } ;
} ;
void _ ()
{
    struct s x = { { { 42 } } };
    struct s y ;
    y = x ;
}
)";

    checkTypes(
        s,
        Expectation()
            .diagnostic(
                Expectation::ErrorOrWarn::Error,
                TypeChecker::DiagnosticsReporter::ID_of_CannotAssignToExpressionOfConstQualifiedType));
}